

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpPrepass::OnDataSymbol
          (BinaryReaderObjdumpPrepass *this,Index index,uint32_t flags,string_view name,
          Index segment,uint32_t offset,uint32_t size)

{
  pointer pOVar1;
  string_view local_58;
  SymbolType local_48;
  string local_40;
  Index local_20;
  
  local_58.size_ = name.size_;
  local_58.data_ = name.data_;
  local_48 = Data;
  string_view::to_string_abi_cxx11_(&local_40,&local_58);
  local_20 = 0;
  pOVar1 = (((this->super_BinaryReaderObjdumpBase).objdump_state_)->symtab).
           super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>._M_impl.
           super__Vector_impl_data._M_start + index;
  pOVar1->kind = local_48;
  std::__cxx11::string::operator=((string *)&pOVar1->name,(string *)&local_40);
  pOVar1->index = local_20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return (Result)Ok;
}

Assistant:

Result OnDataSymbol(Index index,
                      uint32_t flags,
                      string_view name,
                      Index segment,
                      uint32_t offset,
                      uint32_t size) override {
    objdump_state_->symtab[index] = {SymbolType::Data, name.to_string(), 0};
    return Result::Ok;
  }